

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

void __thiscall TCPConnection::BuildPacket(TCPConnection *this,DataBuffer *buffer,uint8_t flags)

{
  ushort uVar1;
  ProtocolIPv4 *this_00;
  uint16_t value;
  size_t sVar2;
  uint8_t *sourceIP;
  uint64_t uVar3;
  uint8_t *puVar4;
  uint16_t length;
  uint16_t checksum;
  uint8_t *packet;
  uint8_t flags_local;
  DataBuffer *buffer_local;
  TCPConnection *this_local;
  
  sVar2 = ProtocolTCP::header_size();
  buffer->Packet = buffer->Packet + -sVar2;
  puVar4 = buffer->Packet;
  uVar1 = buffer->Length;
  if (puVar4 != (uint8_t *)0x0) {
    Pack16(puVar4,0,this->LocalPort);
    Pack16(puVar4,2,this->RemotePort);
    Pack32(puVar4,4,this->SequenceNumber);
    if (0 < (int)(this->AcknowledgementNumber - this->LastAck)) {
      this->LastAck = this->AcknowledgementNumber;
    }
    Pack32(puVar4,8,this->AcknowledgementNumber);
    puVar4[0xc] = 'P';
    puVar4[0xd] = flags | 0x10;
    Pack16(puVar4,0xe,this->CurrentWindow);
    Pack16(puVar4,0x10,0);
    Pack16(puVar4,0x12,0);
    this->SequenceNumber = (uint)uVar1 + this->SequenceNumber;
    buffer->AcknowledgementNumber = this->SequenceNumber;
    while ((int)(this->MaxSequenceTx - this->SequenceNumber) < 0) {
      printf("tx window full\n");
      osEvent::Wait(&this->Event,
                    "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/TCPConnection.cpp"
                    ,0x7c,-1);
    }
    sVar2 = ProtocolTCP::header_size();
    sourceIP = ProtocolIPv4::GetUnicastAddress(this->IP);
    value = ProtocolTCP::ComputeChecksum(puVar4,uVar1 + (short)sVar2,sourceIP,this->RemoteAddress);
    Pack16(puVar4,0x10,value);
    sVar2 = ProtocolTCP::header_size();
    buffer->Length = buffer->Length + (short)sVar2;
    if ((uVar1 != 0) || ((flags & 3) != 0)) {
      buffer->Disposable = false;
      uVar3 = osTime::GetTime();
      buffer->Time_us = (uint32_t)uVar3;
      osMutex::Take(&this->HoldingQueueLock,
                    "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/TCPConnection.cpp"
                    ,0x8a);
      osQueue::Put(&this->HoldingQueue,buffer);
      osMutex::Give(&this->HoldingQueueLock);
    }
    this_00 = this->IP;
    puVar4 = ProtocolIPv4::GetUnicastAddress(this->IP);
    ProtocolIPv4::Transmit(this_00,buffer,'\x06',this->RemoteAddress,puVar4);
  }
  return;
}

Assistant:

void TCPConnection::BuildPacket(DataBuffer* buffer, uint8_t flags)
{
    uint8_t* packet;
    uint16_t checksum;
    uint16_t length;

    flags |= FLAG_ACK;

    buffer->Packet -= ProtocolTCP::header_size();
    packet = buffer->Packet;
    length = buffer->Length;
    if (packet != nullptr)
    {
        Pack16(packet, 0, LocalPort);
        Pack16(packet, 2, RemotePort);
        Pack32(packet, 4, SequenceNumber);
        if ((int32_t)(AcknowledgementNumber - LastAck) > 0)
        {
            // Only advance LastAck if Ack > LastAck
            LastAck = AcknowledgementNumber;
        }
        Pack32(packet, 8, AcknowledgementNumber);
        packet[12] = 0x50; // Header length and reserved
        packet[13] = flags;
        Pack16(packet, 14, CurrentWindow);
        Pack16(packet, 16, 0); // checksum placeholder
        Pack16(packet, 18, 0); // urgent pointer

        SequenceNumber += length;
        buffer->AcknowledgementNumber = SequenceNumber;

        while ((int32_t)(MaxSequenceTx - SequenceNumber) < 0)
        {
            printf("tx window full\n");
            Event.Wait(__FILE__, __LINE__);
        }

        checksum = ProtocolTCP::ComputeChecksum(
            packet, length + ProtocolTCP::header_size(), IP->GetUnicastAddress(), RemoteAddress);

        Pack16(packet, 16, checksum); // checksum

        buffer->Length += ProtocolTCP::header_size();

        if (length > 0 || (flags & (FLAG_SYN | FLAG_FIN)))
        {
            buffer->Disposable = false;
            buffer->Time_us = (uint32_t)osTime::GetTime();
            HoldingQueueLock.Take(__FILE__, __LINE__);
            HoldingQueue.Put(buffer);
            HoldingQueueLock.Give();
        }

        IP->Transmit(buffer, 0x06, RemoteAddress, IP->GetUnicastAddress());
    }
}